

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::Psbt::GetGlobalXpubkeyBip32(KeyData *__return_storage_ptr__,Psbt *this,ExtPubkey *key)

{
  size_t sVar1;
  uchar *puVar2;
  size_type sVar3;
  ulong local_110;
  size_t arr_index;
  uint32_t *val_arr;
  size_t arr_max;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_arr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fingerprint;
  ByteData data;
  ByteData local_70;
  undefined1 local_58 [8];
  ByteData key_data;
  ByteData key_top;
  uint8_t xpub_key;
  ExtPubkey *key_local;
  Psbt *this_local;
  
  key_top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  ByteData::ByteData((ByteData *)
                     &key_data.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (uint8_t *)
                     ((long)&key_top.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),1);
  ExtPubkey::GetData(&local_70,key);
  ByteData::Concat<cfd::core::ByteData>
            ((ByteData *)local_58,
             (ByteData *)
             &key_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_70);
  ByteData::~ByteData(&local_70);
  GetGlobalRecord((ByteData *)
                  &fingerprint.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,this,(ByteData *)local_58);
  ByteData::ByteData((ByteData *)
                     &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &data_arr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar1 = ByteData::GetDataSize
                    ((ByteData *)
                     &fingerprint.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if ((sVar1 & 3) == 0) {
    sVar1 = ByteData::GetDataSize
                      ((ByteData *)
                       &fingerprint.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (sVar1 != 0) {
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,
                         (ByteData *)
                         &fingerprint.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
      ByteData::ByteData((ByteData *)&arr_max,puVar2,4);
      ByteData::operator=((ByteData *)
                          &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)&arr_max);
      ByteData::~ByteData((ByteData *)&arr_max);
      sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
      puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
      for (local_110 = 1; local_110 < sVar3 >> 2; local_110 = local_110 + 1) {
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &data_arr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)(puVar2 + local_110 * 4));
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    }
  }
  KeyData::KeyData(__return_storage_ptr__,key,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &data_arr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (ByteData *)
                   &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &data_arr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &fingerprint.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)local_58);
  ByteData::~ByteData((ByteData *)
                      &key_data.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

KeyData Psbt::GetGlobalXpubkeyBip32(const ExtPubkey &key) const {
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetData());
  auto data = GetGlobalRecord(key_data);

  ByteData fingerprint;
  std::vector<uint32_t> path;
  if (((data.GetDataSize() % 4) == 0) && (data.GetDataSize() > 0)) {
    auto data_arr = data.GetBytes();
    fingerprint = ByteData(data_arr.data(), 4);

    // TODO(k-matsuzawa) Need endian support.
    size_t arr_max = data_arr.size() / 4;
    uint32_t *val_arr = reinterpret_cast<uint32_t *>(data_arr.data());
    for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
      path.push_back(val_arr[arr_index]);
    }
  }
  return KeyData(key, path, fingerprint);
}